

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O0

void sinc_close(SRC_STATE *state)

{
  void *__ptr;
  SINC_FILTER *sinc;
  SRC_STATE *state_local;
  
  if (state != (SRC_STATE *)0x0) {
    __ptr = state->private_data;
    if (__ptr != (void *)0x0) {
      if (*(long *)((long)__ptr + 0x858) != 0) {
        free(*(void **)((long)__ptr + 0x858));
        *(undefined8 *)((long)__ptr + 0x858) = 0;
      }
      free(__ptr);
    }
    free(state);
  }
  return;
}

Assistant:

static void
sinc_close (SRC_STATE *state)
{
	if (state)
	{
		SINC_FILTER *sinc = (SINC_FILTER *) state->private_data ;
		if (sinc)
		{
			if (sinc->buffer)
			{
				free (sinc->buffer) ;
				sinc->buffer = NULL ;
			}
			free (sinc) ;
			sinc = NULL ;
		}
		free (state) ;
		state = NULL ;
	}
}